

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O1

void __thiscall agge::tests::RectangleTests::RectangleIteratorListsItsVertices(RectangleTests *this)

{
  rectangle r2;
  rectangle r1;
  undefined1 local_1c8 [8];
  int local_1c0;
  point local_1bc;
  undefined8 local_1b0;
  int local_1a8;
  point local_1a4;
  real_t rStack_198;
  real_t rStack_194;
  int iStack_190;
  point local_18c;
  undefined1 local_178 [44];
  int local_14c;
  pointer local_148;
  int local_140;
  pointer local_13c;
  int local_134;
  point local_128;
  undefined8 local_11c;
  undefined4 local_114;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_104;
  undefined4 local_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined8 local_ec;
  undefined4 local_e4;
  point local_d8;
  point local_cc;
  point local_c0;
  point local_b4;
  point local_a8;
  point local_9c;
  string local_88;
  LocationInfo local_68;
  rectangle local_40;
  rectangle local_2c;
  
  rectangle::rectangle(&local_2c,10.1,20.2,30.0,4.7);
  local_128.command = 0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_d8.command = rectangle::vertex(&local_2c,&local_128.x,&local_128.y);
  local_d8.x = local_128.x;
  local_d8.y = local_128.y;
  local_128.command = 0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_cc.command = rectangle::vertex(&local_2c,&local_128.x,&local_128.y);
  local_cc.x = local_128.x;
  local_cc.y = local_128.y;
  local_128.command = 0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_c0.command = rectangle::vertex(&local_2c,&local_128.x,&local_128.y);
  local_c0.x = local_128.x;
  local_c0.y = local_128.y;
  local_128.command = 0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_b4.command = rectangle::vertex(&local_2c,&local_128.x,&local_128.y);
  local_b4.x = local_128.x;
  local_b4.y = local_128.y;
  local_128.command = 0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_a8.command = rectangle::vertex(&local_2c,&local_128.x,&local_128.y);
  local_a8.x = local_128.x;
  local_a8.y = local_128.y;
  local_128.command = 0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_9c.command = rectangle::vertex(&local_2c,&local_128.x,&local_128.y);
  local_9c.x = local_128.x;
  local_9c.y = local_128.y;
  local_128.x = 10.1;
  local_128.y = 20.2;
  local_128.command = 1;
  local_11c = 0x41a1999a41f00000;
  local_114 = 2;
  local_110 = 0x4096666641f00000;
  local_108 = 2;
  local_104 = 0x409666664121999a;
  local_fc = 2;
  uStack_f8 = 0;
  uStack_f4 = 0;
  uStack_f0 = 0x30;
  local_ec = 0;
  local_e4 = 0;
  local_1c8 = (undefined1  [8])&local_1bc.y;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_178,(string *)local_1c8,0x76);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])&local_128,(point (*) [6])&local_d8,(LocationInfo *)local_178);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_);
  }
  if (local_1c8 != (undefined1  [8])&local_1bc.y) {
    operator_delete((void *)local_1c8);
  }
  rectangle::rectangle(&local_40,11.1,12.2,13.3,1.7);
  local_1c0 = 0;
  local_1c8 = (undefined1  [8])0x0;
  local_178._8_4_ = rectangle::vertex(&local_40,(real_t *)local_1c8,(real_t *)(local_1c8 + 4));
  local_178._0_8_ = local_1c8;
  local_1c0 = 0;
  local_1c8 = (undefined1  [8])0x0;
  local_178._20_4_ = rectangle::vertex(&local_40,(real_t *)local_1c8,(real_t *)(local_1c8 + 4));
  local_178._12_8_ = local_1c8;
  local_1c0 = 0;
  local_1c8 = (undefined1  [8])0x0;
  local_178._32_4_ = rectangle::vertex(&local_40,(real_t *)local_1c8,(real_t *)(local_1c8 + 4));
  local_178._24_8_ = local_1c8;
  local_1c0 = 0;
  local_1c8 = (undefined1  [8])0x0;
  local_14c = rectangle::vertex(&local_40,(real_t *)local_1c8,(real_t *)(local_1c8 + 4));
  local_178._36_8_ = local_1c8;
  local_1c0 = 0;
  local_1c8 = (undefined1  [8])0x0;
  local_140 = rectangle::vertex(&local_40,(real_t *)local_1c8,(real_t *)(local_1c8 + 4));
  local_148 = (pointer)local_1c8;
  local_1c0 = 0;
  local_1c8 = (undefined1  [8])0x0;
  local_134 = rectangle::vertex(&local_40,(real_t *)local_1c8,(real_t *)(local_1c8 + 4));
  local_13c = (pointer)local_1c8;
  local_1c8 = (undefined1  [8])0x414333334131999a;
  local_1c0 = 1;
  local_1bc.x = 13.3;
  local_1bc.y = 12.2;
  local_1bc.command = 2;
  local_1b0 = 0x3fd9999a4154cccd;
  local_1a8 = 2;
  local_1a4.x = 11.1;
  local_1a4.y = 1.7;
  local_1a4.command = 2;
  rStack_198 = 0.0;
  rStack_194 = 0.0;
  iStack_190 = 0x30;
  local_18c.x = 0.0;
  local_18c.y = 0.0;
  local_18c.command = 0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_68,&local_88,0x84);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_1c8,(point (*) [6])local_178,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.filename._M_dataplus._M_p != &local_68.filename.field_2) {
    operator_delete(local_68.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( RectangleIteratorListsItsVertices )
			{
				// INIT
				rectangle r1(10.1f, 20.2f, 30.0f, 4.7f);

				// ACT
				mocks::path::point points1[] = { vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				rectangle r2(11.1f, 12.2f, 13.3f, 1.7f);

				// ACT
				mocks::path::point points2[] = { vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(11.1f, 12.2f), lineto(13.3f, 12.2f), lineto(13.3f, 1.7f), lineto(11.1f, 1.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference2, points2);
			}